

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONState.h
# Opt level: O1

string * __thiscall
cmJSONState::Error::GetErrorMessage_abi_cxx11_(string *__return_storage_ptr__,Error *this)

{
  int val;
  pointer pcVar1;
  cmAlphaNum *pcVar2;
  cmAlphaNum *pcVar3;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string local_140;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_120;
  size_t local_108;
  string *local_100;
  cmAlphaNum *local_f8;
  undefined8 local_f0;
  char *local_e8;
  undefined8 local_e0;
  size_t local_d8;
  string *local_d0;
  cmAlphaNum *local_c8;
  undefined8 local_c0;
  char *local_b8;
  undefined8 local_b0;
  size_type local_a8;
  pointer local_a0;
  undefined8 local_98;
  undefined1 local_90 [56];
  cmAlphaNum local_58;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->message)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->message)._M_string_length);
  val = (this->location).line;
  if (0 < val) {
    local_120.first._M_len = 8;
    local_120.first._M_str = "Error: @";
    local_120.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    cmAlphaNum::cmAlphaNum(&local_58,val);
    pcVar2 = (cmAlphaNum *)&local_58.View_._M_str;
    if ((cmAlphaNum *)local_58.RValueString_ != (cmAlphaNum *)0x0) {
      pcVar2 = (cmAlphaNum *)local_58.RValueString_;
    }
    local_100 = pcVar2->RValueString_;
    pcVar2 = &local_58;
    if ((cmAlphaNum *)local_58.RValueString_ != (cmAlphaNum *)0x0) {
      pcVar2 = (cmAlphaNum *)local_58.RValueString_;
    }
    local_108 = (pcVar2->View_)._M_len;
    local_f8 = (cmAlphaNum *)local_58.RValueString_;
    local_f0 = 1;
    local_e8 = ",";
    local_e0 = 0;
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_90,(this->location).column);
    pcVar3 = (cmAlphaNum *)local_90;
    pcVar2 = (cmAlphaNum *)(local_90 + 0x10);
    if ((cmAlphaNum *)local_90._0_8_ != (cmAlphaNum *)0x0) {
      pcVar3 = (cmAlphaNum *)local_90._0_8_;
      pcVar2 = (cmAlphaNum *)local_90._0_8_;
    }
    local_d0 = pcVar2->RValueString_;
    local_d8 = (pcVar3->View_)._M_len;
    local_c8 = (cmAlphaNum *)local_90._0_8_;
    local_c0 = 2;
    local_b8 = ": ";
    local_b0 = 0;
    local_a0 = (__return_storage_ptr__->_M_dataplus)._M_p;
    local_a8 = __return_storage_ptr__->_M_string_length;
    local_98 = 0;
    views._M_len = 6;
    views._M_array = &local_120;
    cmCatViews(&local_140,views);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetErrorMessage() const
    {
      std::string output = message;
      if (location.line > 0) {
        output = cmStrCat("Error: @", location.line, ",", location.column,
                          ": ", output);
      }
      return output;
    }